

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

int32_t utrie_unserialize_63(UTrie *trie,void *data,int32_t length,UErrorCode *pErrorCode)

{
  uint uVar1;
  UBool UVar2;
  int iVar3;
  uint32_t options;
  uint16_t *p16;
  UTrieHeader *header;
  UErrorCode *pErrorCode_local;
  int32_t length_local;
  void *data_local;
  UTrie *trie_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar2 = U_FAILURE(*pErrorCode), UVar2 != '\0')) {
    return -1;
  }
  if (length < 0x10) {
    *pErrorCode = U_INVALID_FORMAT_ERROR;
    return -1;
  }
  if (*data != 0x54726965) {
    *pErrorCode = U_INVALID_FORMAT_ERROR;
    return -1;
  }
  uVar1 = *(uint *)((long)data + 4);
  if (((uVar1 & 0xf) == 5) && ((uVar1 >> 4 & 0xf) == 2)) {
    trie->isLatin1Linear = (uVar1 & 0x200) != 0;
    trie->indexLength = *(int32_t *)((long)data + 8);
    trie->dataLength = *(int32_t *)((long)data + 0xc);
    iVar3 = length + -0x10;
    if (SBORROW4(iVar3,trie->indexLength * 2) != iVar3 + trie->indexLength * -2 < 0) {
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      return -1;
    }
    trie->index = (uint16_t *)((long)data + 0x10);
    iVar3 = iVar3 + trie->indexLength * -2;
    if ((uVar1 & 0x100) == 0) {
      if (SBORROW4(iVar3,trie->dataLength * 2) != iVar3 + trie->dataLength * -2 < 0) {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        return -1;
      }
      trie->data32 = (uint32_t *)0x0;
      trie->initialValue = (uint)trie->index[trie->indexLength];
      pErrorCode_local._4_4_ = trie->indexLength * 2 + 0x10 + trie->dataLength * 2;
    }
    else {
      if (iVar3 < trie->dataLength * 4) {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        return -1;
      }
      trie->data32 = (uint32_t *)((uint16_t *)((long)data + 0x10) + trie->indexLength);
      trie->initialValue = *trie->data32;
      pErrorCode_local._4_4_ = trie->indexLength * 2 + 0x10 + trie->dataLength * 4;
    }
    trie->getFoldingOffset = utrie_defaultGetFoldingOffset_63;
    return pErrorCode_local._4_4_;
  }
  *pErrorCode = U_INVALID_FORMAT_ERROR;
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_unserialize(UTrie *trie, const void *data, int32_t length, UErrorCode *pErrorCode) {
    const UTrieHeader *header;
    const uint16_t *p16;
    uint32_t options;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return -1;
    }

    /* enough data for a trie header? */
    if(length<(int32_t)sizeof(UTrieHeader)) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return -1;
    }

    /* check the signature */
    header=(const UTrieHeader *)data;
    if(header->signature!=0x54726965) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return -1;
    }

    /* get the options and check the shift values */
    options=header->options;
    if( (options&UTRIE_OPTIONS_SHIFT_MASK)!=UTRIE_SHIFT ||
        ((options>>UTRIE_OPTIONS_INDEX_SHIFT)&UTRIE_OPTIONS_SHIFT_MASK)!=UTRIE_INDEX_SHIFT
    ) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return -1;
    }
    trie->isLatin1Linear= (UBool)((options&UTRIE_OPTIONS_LATIN1_IS_LINEAR)!=0);

    /* get the length values */
    trie->indexLength=header->indexLength;
    trie->dataLength=header->dataLength;

    length-=(int32_t)sizeof(UTrieHeader);

    /* enough data for the index? */
    if(length<2*trie->indexLength) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return -1;
    }
    p16=(const uint16_t *)(header+1);
    trie->index=p16;
    p16+=trie->indexLength;
    length-=2*trie->indexLength;

    /* get the data */
    if(options&UTRIE_OPTIONS_DATA_IS_32_BIT) {
        if(length<4*trie->dataLength) {
            *pErrorCode=U_INVALID_FORMAT_ERROR;
            return -1;
        }
        trie->data32=(const uint32_t *)p16;
        trie->initialValue=trie->data32[0];
        length=(int32_t)sizeof(UTrieHeader)+2*trie->indexLength+4*trie->dataLength;
    } else {
        if(length<2*trie->dataLength) {
            *pErrorCode=U_INVALID_FORMAT_ERROR;
            return -1;
        }

        /* the "data16" data is used via the index pointer */
        trie->data32=NULL;
        trie->initialValue=trie->index[trie->indexLength];
        length=(int32_t)sizeof(UTrieHeader)+2*trie->indexLength+2*trie->dataLength;
    }

    trie->getFoldingOffset=utrie_defaultGetFoldingOffset;

    return length;
}